

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildElementI
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot baseRegSlot,RegSlot indexRegSlot,
          RegSlot regSlot,ProfileId profileId)

{
  JitArenaAllocator *alloc;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  uint uVar7;
  undefined4 *puVar8;
  JITTimeFunctionBody *pJVar9;
  JITTimeProfileInfo *pJVar10;
  byte *pbVar11;
  RegOpnd *baseOpnd;
  RegOpnd *indexOpnd;
  IndirOpnd *dstOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar12;
  IndirOpnd *pIVar13;
  JitProfilingInstr *instr;
  IndirOpnd *pIVar14;
  Func *pFVar15;
  uint uVar16;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType arrayType;
  
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x161e,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_004daa4d;
    *puVar8 = 0;
  }
  ValueType::ValueType((ValueType *)&local_32[0].field_0);
  uVar16 = (uint)newOpcode;
  uVar7 = (uint)newOpcode;
  if (profileId == 0xffff) {
LAB_004da612:
    bVar3 = 0;
    bVar2 = false;
    bVar5 = false;
    local_40 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
    local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
  }
  else {
    if ((uVar7 == 0x9c) || (uVar7 == 0x9a)) {
      bVar2 = DoLoadInstructionArrayProfileInfo(this);
      if (!bVar2) goto LAB_004da612;
      pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      pJVar10 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar9);
      local_40 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                 JITTimeProfileInfo::GetStElemInfo(pJVar10,profileId);
      local_32[0].field_0 =
           *(anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)local_40;
      pbVar11 = (byte *)((long)local_40 + 3);
      bVar2 = true;
      bVar5 = false;
      local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
    }
    else {
      if ((uVar16 != 0x97) || (bVar2 = DoLoadInstructionArrayProfileInfo(this), !bVar2))
      goto LAB_004da612;
      pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      pJVar10 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar9);
      local_48 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                 JITTimeProfileInfo::GetLdElemInfo(pJVar10,profileId);
      local_32[0].field_0 =
           *(anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)local_48;
      pbVar11 = (byte *)((long)local_48 + 5);
      bVar5 = true;
      bVar2 = false;
      local_40 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
    }
    bVar3 = *pbVar11 ^ 1;
  }
  baseOpnd = BuildSrcOpnd(this,baseRegSlot,TyVar);
  indexOpnd = BuildSrcOpnd(this,indexRegSlot,TyVar);
  dstOpnd = IR::IndirOpnd::New(baseOpnd,indexOpnd,TyVar,this->m_func);
  if ((bVar5) || (bVar2)) {
    bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
    if ((bVar4) && (bVar4 = AllowNativeArrayProfileInfo(this), !bVar4)) {
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetArrayTypeId((ValueType *)&local_32[0].field_0,TypeIds_Array);
      alloc = this->m_func->m_alloc;
      if (bVar5) {
        paVar12 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  new<Memory::JitArenaAllocator>(6,alloc,0x3f1274);
        *(undefined4 *)paVar12 = *(undefined4 *)local_48;
        paVar12[2] = local_48[2];
        paVar12->field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_32[0];
        local_48 = paVar12;
      }
      else {
        paVar12 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  new<Memory::JitArenaAllocator>(4,alloc,0x3f1274);
        *(undefined4 *)paVar12 = *(undefined4 *)local_40;
        paVar12->field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_32[0];
        local_40 = paVar12;
      }
    }
    IR::Opnd::SetValueType(&dstOpnd->m_baseOpnd->super_Opnd,(ValueType)local_32[0].field_0);
    BVar6 = Func::HasTry(this->m_func->topFunc);
    if (BVar6 != 0) {
      bVar4 = Func::DoOptimizeTry(this->m_func->topFunc);
      if (!bVar4) {
        bVar2 = false;
        bVar5 = false;
      }
    }
  }
  uVar7 = uVar7 - 0x97;
  pIVar14 = dstOpnd;
  if (uVar7 < 0xf) {
    if ((0x6005U >> (uVar7 & 0x1f) & 1) != 0) goto LAB_004da7b2;
    if ((0x28U >> (uVar7 & 0x1f) & 1) == 0) goto LAB_004da752;
    pIVar13 = (IndirOpnd *)BuildSrcOpnd(this,regSlot,TyVar);
    bVar5 = Func::DoSimpleJitDynamicProfile(this->m_func);
    if ((profileId == 0xffff) || (!bVar5)) {
      pFVar15 = this->m_func;
      if (bVar2) {
        instr = (JitProfilingInstr *)
                IR::ProfiledInstr::New(newOpcode,&dstOpnd->super_Opnd,(Opnd *)pIVar13,pFVar15);
        if ((instr->super_Instr).m_kind != InstrKindProfiled) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
          if (!bVar2) goto LAB_004daa4d;
          *puVar8 = 0;
        }
        *(anon_union_2_4_ea848c7b_for_ValueType_13 **)&instr->profileId = local_40;
        goto LAB_004da930;
      }
      goto LAB_004da793;
    }
    pFVar15 = this->m_func;
LAB_004da8c0:
    instr = IR::JitProfilingInstr::New(newOpcode,&dstOpnd->super_Opnd,&pIVar13->super_Opnd,pFVar15);
    if ((instr->super_Instr).m_kind != InstrKindJitProfiling) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
      if (!bVar2) {
LAB_004daa4d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    instr->profileId = profileId;
  }
  else {
LAB_004da752:
    if ((uVar16 - 0x117 < 0x40) &&
       ((0xe000000000000019U >> ((ulong)(uVar16 - 0x117) & 0x3f) & 1) != 0)) {
      pIVar13 = (IndirOpnd *)BuildSrcOpnd(this,regSlot,TyVar);
      pFVar15 = this->m_func;
    }
    else {
      if (uVar16 != 0x2b) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x16ad,"(false)","Unknown ElementI opcode");
        if (bVar2) {
          *puVar8 = 0;
          return;
        }
        goto LAB_004daa4d;
      }
LAB_004da7b2:
      pIVar14 = (IndirOpnd *)BuildDstOpnd(this,regSlot,TyVar,false,false);
      bVar2 = Func::DoSimpleJitDynamicProfile(this->m_func);
      pIVar13 = dstOpnd;
      if ((profileId != 0xffff) && (bVar2)) {
        pFVar15 = this->m_func;
        dstOpnd = pIVar14;
        goto LAB_004da8c0;
      }
      pFVar15 = this->m_func;
      if (bVar5) {
        instr = (JitProfilingInstr *)
                IR::ProfiledInstr::New(newOpcode,(Opnd *)pIVar14,&dstOpnd->super_Opnd,pFVar15);
        if ((instr->super_Instr).m_kind != InstrKindProfiled) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
          if (!bVar2) goto LAB_004daa4d;
          *puVar8 = 0;
        }
        ((anon_union_8_4_88fdcd80_for_u *)&instr->profileId)->ldElemInfo = (LdElemInfo *)local_48;
        goto LAB_004da930;
      }
    }
LAB_004da793:
    instr = (JitProfilingInstr *)
            IR::Instr::New(newOpcode,&pIVar14->super_Opnd,&pIVar13->super_Opnd,pFVar15);
  }
LAB_004da930:
  AddInstr(this,&instr->super_Instr,offset);
  if (((bVar3 & 1) != 0) && (bVar2 = DoBailOnNoProfile(this), bVar2)) {
    InsertBailOnNoProfile(this,&instr->super_Instr);
  }
  return;
}

Assistant:

void
IRBuilder::BuildElementI(Js::OpCode newOpcode, uint32 offset, Js::RegSlot baseRegSlot, Js::RegSlot indexRegSlot,
                        Js::RegSlot regSlot, Js::ProfileId profileId)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    ValueType arrayType;
    const Js::LdElemInfo *ldElemInfo = nullptr;
    const Js::StElemInfo *stElemInfo = nullptr;
    bool isProfiledLoad = false;
    bool isProfiledStore = false;
    bool isProfiledInstr = (profileId != Js::Constants::NoProfileId);
    bool isLdElemOrStElemThatWasNotProfiled = false;

    if (isProfiledInstr)
    {
        switch (newOpcode)
        {
        case Js::OpCode::LdElemI_A:
            if (!DoLoadInstructionArrayProfileInfo())
            {
                break;
            }
            ldElemInfo = this->m_func->GetReadOnlyProfileInfo()->GetLdElemInfo(profileId);
            arrayType = ldElemInfo->GetArrayType();
            isLdElemOrStElemThatWasNotProfiled = !ldElemInfo->WasProfiled();
            isProfiledLoad = true;
            break;

        case Js::OpCode::StElemI_A:
        case Js::OpCode::StElemI_A_Strict:
            if (!DoLoadInstructionArrayProfileInfo())
            {
                break;
            }
            isProfiledStore = true;
            stElemInfo = this->m_func->GetReadOnlyProfileInfo()->GetStElemInfo(profileId);
            arrayType = stElemInfo->GetArrayType();
            isLdElemOrStElemThatWasNotProfiled = !stElemInfo->WasProfiled();
            break;
        }
    }

    IR::Instr *     instr;
    IR::RegOpnd *   regOpnd;

    IR::IndirOpnd * indirOpnd;
    indirOpnd = this->BuildIndirOpnd(this->BuildSrcOpnd(baseRegSlot), this->BuildSrcOpnd(indexRegSlot));

    if (isProfiledLoad || isProfiledStore)
    {
        if(arrayType.IsLikelyNativeArray() && !AllowNativeArrayProfileInfo())
        {
            arrayType = arrayType.SetArrayTypeId(Js::TypeIds_Array);

            // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the
            // ProfiledInstr.
            if(isProfiledLoad)
            {
                Js::LdElemInfo *const newLdElemInfo = JitAnew(m_func->m_alloc, Js::LdElemInfo, *ldElemInfo);
                newLdElemInfo->arrayType = arrayType;
                ldElemInfo = newLdElemInfo;
            }
            else
            {
                Js::StElemInfo *const newStElemInfo = JitAnew(m_func->m_alloc, Js::StElemInfo, *stElemInfo);
                newStElemInfo->arrayType = arrayType;
                stElemInfo = newStElemInfo;
            }
        }
        indirOpnd->GetBaseOpnd()->SetValueType(arrayType);

        if (m_func->GetTopFunc()->HasTry() && !m_func->GetTopFunc()->DoOptimizeTry())
        {
            isProfiledLoad = false;
            isProfiledStore = false;
        }
    }

    switch (newOpcode)
    {
    case Js::OpCode::LdMethodElem:
    case Js::OpCode::LdElemI_A:
    case Js::OpCode::DeleteElemI_A:
    case Js::OpCode::DeleteElemIStrict_A:
    case Js::OpCode::TypeofElem:
        {
            // Evaluate to register

            regOpnd = this->BuildDstOpnd(regSlot);

            if (m_func->DoSimpleJitDynamicProfile() && isProfiledInstr)
            {
                instr = IR::JitProfilingInstr::New(newOpcode, regOpnd, indirOpnd, m_func);
                instr->AsJitProfilingInstr()->profileId = profileId;
            }
            else if (isProfiledLoad)
            {
                instr = IR::ProfiledInstr::New(newOpcode, regOpnd, indirOpnd, m_func);
                instr->AsProfiledInstr()->u.ldElemInfo = ldElemInfo;
            }
            else
            {
                instr = IR::Instr::New(newOpcode, regOpnd, indirOpnd, m_func);
            }
            break;
        }

    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        {
            // Store

            regOpnd = this->BuildSrcOpnd(regSlot);

            if (m_func->DoSimpleJitDynamicProfile() && isProfiledInstr)
            {
                instr = IR::JitProfilingInstr::New(newOpcode, indirOpnd, regOpnd, m_func);
                instr->AsJitProfilingInstr()->profileId = profileId;
            }
            else if (isProfiledStore)
            {
                instr = IR::ProfiledInstr::New(newOpcode, indirOpnd, regOpnd, m_func);
                instr->AsProfiledInstr()->u.stElemInfo = stElemInfo;
            }
            else
            {
                instr = IR::Instr::New(newOpcode, indirOpnd, regOpnd, m_func);
            }
            break;
        }

    case Js::OpCode::InitSetElemI:
    case Js::OpCode::InitGetElemI:
    case Js::OpCode::InitComputedProperty:
    case Js::OpCode::InitClassMemberComputedName:
    case Js::OpCode::InitClassMemberGetComputedName:
    case Js::OpCode::InitClassMemberSetComputedName:
        {

            regOpnd = this->BuildSrcOpnd(regSlot);

            instr = IR::Instr::New(newOpcode, indirOpnd, regOpnd, m_func);
            break;
        }

    default:
        AssertMsg(false, "Unknown ElementI opcode");
        return;

    }

    this->AddInstr(instr, offset);

    if(isLdElemOrStElemThatWasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}